

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

int __thiscall ON_Displacement::FindSubItemArrayIndex(ON_Displacement *this,int face_index)

{
  int iVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    if ((this->m_impl_dsp->m_subs).m_count <= lVar2) {
      return -1;
    }
    iVar1 = SubItem::FaceIndex((this->m_impl_dsp->m_subs).m_a[lVar2]);
    if (iVar1 == face_index) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int ON_Displacement::FindSubItemArrayIndex(int face_index) const
{
  for (int i = 0; i < m_impl_dsp->m_subs.Count(); i++)
  {
    const auto* sub = m_impl_dsp->m_subs[i];
    if (sub->FaceIndex() == face_index)
      return i;
  }

  return -1;
}